

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

void __thiscall
TransitionObservationIndependentMADPDiscrete::TransitionObservationIndependentMADPDiscrete
          (TransitionObservationIndependentMADPDiscrete *this,void **vtt,
          TransitionObservationIndependentMADPDiscrete *param_2)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"received unspec. by MultiAgentDecisionProcess","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"received unspec. by MultiAgentDecisionProcess","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"received unspec. by MultiAgentDecisionProcess","");
  MultiAgentDecisionProcess::MultiAgentDecisionProcess
            (&this->super_MultiAgentDecisionProcess,vtt + 1,&local_50,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pvVar1 = *vtt;
  *(void **)&this->super_MultiAgentDecisionProcess = pvVar1;
  *(void **)(&(this->super_MultiAgentDecisionProcess).field_0x0 + *(long *)((long)pvVar1 + -0x40)) =
       vtt[3];
  *(void **)(&(this->super_MultiAgentDecisionProcess).field_0x0 +
            *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x48)) = vtt[4];
  (this->_m_jointToIndActionCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_jointToIndActionCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jointToIndActionCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jointStates).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jointStates).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jointStates).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_jointToIndObsCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jointToIndObsCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jointToIndObsCache).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3 = ZEXT432(0) << 0x40;
  this->_m_individualMADPDs =
       (vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
        )auVar3._0_24_;
  (this->_m_jointActionVec).
  super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar3._24_8_;
  *(undefined1 (*) [32])
   &(this->_m_individualMADPDs).
    super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar3;
  auVar4 = ZEXT464(0) << 0x20;
  this->_m_actionStepSize = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar4._0_24_;
  this->_m_observationStepSize =
       (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar4._24_24_;
  (this->_m_stateStepSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)auVar4._48_8_;
  (this->_m_stateStepSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)auVar4._56_8_;
  *(undefined1 (*) [64])
   &(this->_m_stateStepSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = auVar4;
  this->_m_nrIndivActions = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar4._0_24_;
  this->_m_nrIndivObs = (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar4._24_24_;
  (this->_m_indivObs).
  super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar4._48_8_;
  (this->_m_indivObs).
  super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar4._56_8_;
  *(undefined1 (*) [64])
   &(this->_m_nrIndivObs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar4;
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar2 = &PTR__E_0059bd80;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar2 + 1),
             "TransitionObservationIndependentMADPDiscrete: copy ctor not implemented","");
  __cxa_throw(puVar2,&E::typeinfo,E::~E);
}

Assistant:

TransitionObservationIndependentMADPDiscrete::
TransitionObservationIndependentMADPDiscrete(
    const TransitionObservationIndependentMADPDiscrete&)
{
    throw(E("TransitionObservationIndependentMADPDiscrete: copy ctor not implemented"));
}